

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O2

void __thiscall Effects_Buffer::end_frame(Effects_Buffer *this,blip_time_t clock_count)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  
  piVar4 = (int *)&this->field_0x58;
  uVar6 = 0;
  for (lVar5 = 0; lVar5 < this->buf_count; lVar5 = lVar5 + 1) {
    iVar2 = *piVar4;
    *piVar4 = 0;
    uVar6 = uVar6 | iVar2 << ((byte)lVar5 & 0x1f);
    Blip_Buffer::end_frame((Blip_Buffer *)(piVar4 + -0xe),clock_count);
    piVar4 = piVar4 + 0x10;
  }
  bVar1 = (this->config_).effects_enabled;
  uVar3 = 6;
  if (bVar1 != false) {
    uVar3 = 0x78;
  }
  if ((this->buf_count == 7) && ((uVar3 & uVar6) != 0)) {
    this->stereo_remain = (ulong)*(ushort *)&this->field_0x26 + 8;
  }
  if ((this->effects_enabled | bVar1) == 1) {
    this->effect_remain = (ulong)*(ushort *)&this->field_0x26 + 8;
  }
  this->effects_enabled = bVar1;
  return;
}

Assistant:

void Effects_Buffer::end_frame( blip_time_t clock_count )
{
	int bufs_used = 0;
	for ( int i = 0; i < buf_count; i++ )
	{
		bufs_used |= bufs [i].clear_modified() << i;
		bufs [i].end_frame( clock_count );
	}
	
	int stereo_mask = (config_.effects_enabled ? 0x78 : 0x06);
	if ( (bufs_used & stereo_mask) && buf_count == max_buf_count )
		stereo_remain = bufs [0].samples_avail() + bufs [0].output_latency();
	
	if ( effects_enabled || config_.effects_enabled )
		effect_remain = bufs [0].samples_avail() + bufs [0].output_latency();
	
	effects_enabled = config_.effects_enabled;
}